

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_icu::date_format<char>::date_format
          (date_format<char> *this,
          unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *fmt,
          string *codepage)

{
  pointer pDVar1;
  string *in_RDX;
  unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *in_RSI;
  unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *in_RDI;
  cpcvt_type in_stack_ffffffffffffffc4;
  string *in_stack_ffffffffffffffc8;
  icu_std_converter<char,_1> *in_stack_ffffffffffffffd0;
  
  formatter<char>::formatter((formatter<char> *)in_RDI);
  ((base_formatter *)&in_RDI->_M_t)->_vptr_base_formatter = (_func_int **)&PTR__date_format_002eaf70
  ;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,in_RDX);
  icu_std_converter<char,_1>::icu_std_converter
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::unique_ptr
            (in_RDI,in_RSI);
  pDVar1 = std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::get
                     (in_RDI);
  in_RDI[8]._M_t.super___uniq_ptr_impl<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>
  ._M_t.super__Tuple_impl<0UL,_icu_70::DateFormat_*,_std::default_delete<icu_70::DateFormat>_>.
  super__Head_base<0UL,_icu_70::DateFormat_*,_false>._M_head_impl = pDVar1;
  return;
}

Assistant:

date_format(std::unique_ptr<icu::DateFormat> fmt,std::string codepage) :
                cvt_(codepage),
                aicu_fmt_(std::move(fmt))
            {
                icu_fmt_ = aicu_fmt_.get();
            }